

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O1

int google::protobuf::compiler::ruby::GeneratePackageModules(FileDescriptor *file,Printer *printer)

{
  LogMessage *pLVar1;
  long lVar2;
  char *pcVar3;
  int iVar4;
  undefined8 unaff_R15;
  ulong uVar5;
  string package_name;
  string component;
  string delimiter;
  undefined1 *local_d8;
  char *local_d0;
  undefined1 local_c8 [16];
  string local_b8;
  long local_98;
  ulong local_90;
  string local_88;
  int *local_68 [2];
  int local_58 [10];
  
  local_d8 = local_c8;
  local_d0 = (char *)0x0;
  local_c8[0] = 0;
  if ((*(byte *)(*(long *)(file + 0x78) + 0x29) & 2) == 0) {
    uVar5 = CONCAT71((int7)((ulong)unaff_R15 >> 8),1);
    std::__cxx11::string::_M_assign((string *)&local_d8);
  }
  else {
    std::__cxx11::string::_M_assign((string *)&local_d8);
    uVar5 = 0;
    lVar2 = std::__cxx11::string::find((char *)&local_d8,0x419f58,0);
    if (lVar2 == -1) {
      internal::LogMessage::LogMessage
                ((LogMessage *)local_68,LOGLEVEL_WARNING,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/ruby/ruby_generator.cc"
                 ,0x1a9);
      pLVar1 = internal::LogMessage::operator<<
                         ((LogMessage *)local_68,"ruby_package option should be in the form of:");
      pLVar1 = internal::LogMessage::operator<<(pLVar1," \'A::B::C\' and not \'A.B.C\'");
      internal::LogFinisher::operator=((LogFinisher *)&local_b8,pLVar1);
      internal::LogMessage::~LogMessage((LogMessage *)local_68);
      uVar5 = 1;
    }
  }
  pcVar3 = "::";
  if ((char)uVar5 != '\0') {
    pcVar3 = ".";
  }
  local_68[0] = &((LogMessage *)local_68)->line_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,pcVar3,pcVar3 + (2 - (uVar5 & 0xff)));
  if (local_d0 == (char *)0x0) {
    iVar4 = 0;
  }
  else {
    local_98 = 2 - (uVar5 & 0xff);
    iVar4 = 0;
    local_90 = uVar5;
    do {
      lVar2 = std::__cxx11::string::find((char *)&local_d8,(ulong)local_68[0],0);
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      local_b8._M_string_length = 0;
      local_b8.field_2._M_local_buf[0] = '\0';
      if (lVar2 == -1) {
        std::__cxx11::string::_M_assign((string *)&local_b8);
        std::__cxx11::string::_M_replace((ulong)&local_d8,0,local_d0,0x3e25d9);
      }
      else {
        std::__cxx11::string::substr((ulong)&local_88,(ulong)&local_d8);
        std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p);
        }
        std::__cxx11::string::substr((ulong)&local_88,(ulong)&local_d8);
        std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p);
        }
      }
      if ((char)local_90 != '\0') {
        PackageToModule(&local_88,&local_b8);
        std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p);
        }
      }
      io::Printer::Print<char[5],std::__cxx11::string>
                (printer,"module $name$\n",(char (*) [5])0x3f58c9,&local_b8);
      io::Printer::Indent(printer);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      iVar4 = iVar4 + 1;
    } while (local_d0 != (char *)0x0);
  }
  if (local_68[0] != &((LogMessage *)local_68)->line_) {
    operator_delete(local_68[0]);
  }
  if (local_d8 != local_c8) {
    operator_delete(local_d8);
  }
  return iVar4;
}

Assistant:

int GeneratePackageModules(const FileDescriptor* file, io::Printer* printer) {
  int levels = 0;
  bool need_change_to_module = true;
  std::string package_name;

  // Determine the name to use in either format:
  //   proto package:         one.two.three
  //   option ruby_package:   One::Two::Three
  if (file->options().has_ruby_package()) {
    package_name = file->options().ruby_package();

    // If :: is in the package use the Ruby formatted name as-is
    //    -> A::B::C
    // otherwise, use the dot separator
    //    -> A.B.C
    if (package_name.find("::") != std::string::npos) {
      need_change_to_module = false;
    } else {
      GOOGLE_LOG(WARNING) << "ruby_package option should be in the form of:"
                          << " 'A::B::C' and not 'A.B.C'";
    }
  } else {
    package_name = file->package();
  }

  // Use the appropriate delimiter
  std::string delimiter = need_change_to_module ? "." : "::";
  int delimiter_size = need_change_to_module ? 1 : 2;

  // Extract each module name and indent
  while (!package_name.empty()) {
    size_t dot_index = package_name.find(delimiter);
    std::string component;
    if (dot_index == std::string::npos) {
      component = package_name;
      package_name = "";
    } else {
      component = package_name.substr(0, dot_index);
      package_name = package_name.substr(dot_index + delimiter_size);
    }
    if (need_change_to_module) {
      component = PackageToModule(component);
    }
    printer->Print(
      "module $name$\n",
      "name", component);
    printer->Indent();
    levels++;
  }
  return levels;
}